

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

Abc_Cex_t * Cex_ManGenCex(Cec_ManSat_t *p,int iOut)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  Gia_Obj_t *pObj;
  int local_24;
  int iVar;
  int i;
  Abc_Cex_t *pCex;
  int iOut_local;
  Cec_ManSat_t *p_local;
  
  iVar1 = Gia_ManCiNum(p->pAig);
  pAVar2 = Abc_CexAlloc(0,iVar1,1);
  pAVar2->iPo = iOut;
  pAVar2->iFrame = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManCiNum(p->pAig);
    if (iVar1 <= local_24) break;
    pObj = Gia_ManCi(p->pAig,local_24);
    iVar1 = Cec_ObjSatNum(p,pObj);
    if (0 < iVar1) {
      iVar1 = sat_solver_var_value(p->pSat,iVar1);
      if (iVar1 != 0) {
        (&pAVar2[1].iPo)[local_24 >> 5] =
             1 << ((byte)local_24 & 0x1f) | (&pAVar2[1].iPo)[local_24 >> 5];
      }
    }
    local_24 = local_24 + 1;
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Cex_ManGenCex( Cec_ManSat_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p->pAig), 1 );
    pCex->iPo = iOut;
    pCex->iFrame = 0;
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        int iVar = Cec_ObjSatNum(p, Gia_ManCi(p->pAig, i));
        if ( iVar > 0 && sat_solver_var_value(p->pSat, iVar) )
            pCex->pData[i>>5] |= (1<<(i & 31));     
    }
    return pCex;
}